

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmenu.cpp
# Opt level: O3

void QMenu::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  ushort uVar1;
  byte *pbVar2;
  code *pcVar3;
  long lVar4;
  QArrayData *pQVar5;
  QIcon *pQVar6;
  undefined8 uVar7;
  QIcon QVar8;
  byte bVar9;
  undefined8 *puVar10;
  int iVar11;
  long in_FS_OFFSET;
  QIcon local_40;
  QIcon local_38;
  QIcon *local_30;
  undefined8 local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      goto switchD_0045f2ac_caseD_0;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) break;
      iVar11 = 1;
      goto LAB_0045f697;
    case 2:
      local_40.d = *_a[1];
      iVar11 = 2;
      goto LAB_0045f605;
    case 3:
      local_40.d = *_a[1];
      iVar11 = 3;
LAB_0045f605:
      local_30 = &local_40;
      local_38.d = (QIconPrivate *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar11,&local_38.d);
      goto switchD_0045f290_caseD_3;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        internalDelayedPopup((QMenu *)_o);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMenuPrivate::_q_actionTriggered(*(QMenuPrivate **)(_o + 8));
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMenuPrivate::_q_actionHovered(*(QMenuPrivate **)(_o + 8));
        return;
      }
      break;
    case 7:
      *(undefined8 *)(*(long *)(_o + 8) + 0x3a8) = *(undefined8 *)(*(long *)(_o + 8) + 0x3b0);
      goto switchD_0045f290_caseD_3;
    case 8:
      _o = *(QObject **)(*(long *)(_o + 8) + 8);
      goto switchD_0045f2ac_caseD_0;
    default:
      goto switchD_0045f290_caseD_3;
    }
    goto LAB_0045f6a5;
  case ReadProperty:
    if (4 < (uint)_id) break;
    pbVar2 = (byte *)*_a;
    switch(_id) {
    case 0:
      *pbVar2 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x420) >> 9) & 1;
      break;
    case 1:
      QAction::text();
      pQVar5 = *(QArrayData **)pbVar2;
      *(QIconPrivate **)pbVar2 = local_38.d;
      pQVar6 = *(QIcon **)(pbVar2 + 8);
      *(QIcon **)(pbVar2 + 8) = local_30;
      uVar7 = *(undefined8 *)(pbVar2 + 0x10);
      *(undefined8 *)(pbVar2 + 0x10) = local_28;
      local_38.d = (QIconPrivate *)pQVar5;
      local_30 = pQVar6;
      local_28 = uVar7;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,2,0x10);
        }
      }
      break;
    case 2:
      QAction::icon();
      QVar8.d = local_40.d;
      local_40.d = (QIconPrivate *)0x0;
      local_38.d = *(QIconPrivate **)pbVar2;
      *(QIconPrivate **)pbVar2 = QVar8.d;
      QIcon::~QIcon(&local_38);
      QIcon::~QIcon(&local_40);
      break;
    case 3:
      bVar9 = *(byte *)(*(long *)(_o + 8) + 0x420) >> 3;
      goto LAB_0045f4f6;
    case 4:
      bVar9 = *(byte *)(*(long *)(_o + 8) + 0x420) >> 4;
LAB_0045f4f6:
      *pbVar2 = bVar9 & 1;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      pbVar2 = (byte *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTearOffEnabled((QMenu *)_o,(bool)*pbVar2);
          return;
        }
        break;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QAction::setText(*(QString **)(*(long *)(_o + 8) + 0x3a8));
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QAction::setIcon(*(QIcon **)(*(long *)(_o + 8) + 0x3a8));
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setSeparatorsCollapsible((QMenu *)_o,(bool)*pbVar2);
          return;
        }
        break;
      case 4:
        uVar1 = *(ushort *)(*(long *)(_o + 8) + 0x420);
        if (((uVar1 & 0x10) == 0) == (bool)*pbVar2) {
          *(ushort *)(*(long *)(_o + 8) + 0x420) = uVar1 & 0xffef | (ushort)*pbVar2 << 4;
        }
        goto switchD_0045f290_caseD_3;
      }
      goto LAB_0045f6a5;
    }
    break;
  case IndexOfMethod:
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == aboutToShow && lVar4 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar3 == aboutToHide && lVar4 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar3 == triggered && lVar4 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar3 == hovered && lVar4 == 0) {
      *(undefined4 *)*_a = 3;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if ((_id == 2) || (_id == 3)) {
      puVar10 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar10 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
        break;
      }
    }
    else {
      puVar10 = (undefined8 *)*_a;
    }
    *puVar10 = 0;
  }
switchD_0045f290_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0045f6a5:
  __stack_chk_fail();
switchD_0045f2ac_caseD_0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    iVar11 = 0;
LAB_0045f697:
    QMetaObject::activate(_o,&staticMetaObject,iVar11,(void **)0x0);
    return;
  }
  goto LAB_0045f6a5;
}

Assistant:

void QMenu::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMenu *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->aboutToShow(); break;
        case 1: _t->aboutToHide(); break;
        case 2: _t->triggered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 3: _t->hovered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 4: _t->internalDelayedPopup(); break;
        case 5: _t->d_func()->_q_actionTriggered(); break;
        case 6: _t->d_func()->_q_actionHovered(); break;
        case 7: _t->d_func()->_q_overrideMenuActionDestroyed(); break;
        case 8: _t->d_func()->_q_platformMenuAboutToShow(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)()>(_a, &QMenu::aboutToShow, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)()>(_a, &QMenu::aboutToHide, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)(QAction * )>(_a, &QMenu::triggered, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)(QAction * )>(_a, &QMenu::hovered, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isTearOffEnabled(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->title(); break;
        case 2: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->separatorsCollapsible(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->toolTipsVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTearOffEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setTitle(*reinterpret_cast<QString*>(_v)); break;
        case 2: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 3: _t->setSeparatorsCollapsible(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setToolTipsVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}